

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_avx2.c
# Opt level: O3

uint64_t aom_sum_sse_2d_i16_avx2(int16_t *src,int src_stride,int width,int height,int *sum)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  uint uVar7;
  uint64_t uVar8;
  int iVar9;
  undefined1 (*pauVar10) [32];
  long lVar11;
  undefined1 auVar12 [64];
  undefined1 auVar13 [32];
  undefined1 auVar14 [64];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [64];
  
  if ((width == 4) && (height == 4)) {
    uVar8 = aom_sum_sse_2d_i16_4x4_sse2(src,src_stride,sum);
    return uVar8;
  }
  uVar7 = height & 3;
  if ((width == 4) && (uVar7 == 0)) {
    uVar8 = aom_sum_sse_2d_i16_4xn_sse2(src,src_stride,height,sum);
    return uVar8;
  }
  if ((width == 8) && (uVar7 == 0)) {
    uVar8 = aom_sum_sse_2d_i16_nxn_sse2(src,src_stride,8,height,sum);
    return uVar8;
  }
  if (uVar7 != 0 || (width & 0xfU) != 0) {
    uVar8 = aom_sum_sse_2d_i16_c(src,src_stride,width,height,sum);
    return uVar8;
  }
  if (height < 1) {
    auVar16 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar13 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  }
  else {
    iVar9 = 0;
    auVar12 = ZEXT1664((undefined1  [16])0x0);
    auVar15._8_2_ = 1;
    auVar15._0_8_ = 0x1000100010001;
    auVar15._10_2_ = 1;
    auVar15._12_2_ = 1;
    auVar15._14_2_ = 1;
    auVar15._16_2_ = 1;
    auVar15._18_2_ = 1;
    auVar15._20_2_ = 1;
    auVar15._22_2_ = 1;
    auVar15._24_2_ = 1;
    auVar15._26_2_ = 1;
    auVar15._28_2_ = 1;
    auVar15._30_2_ = 1;
    auVar14 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar17 = ZEXT1664((undefined1  [16])0x0);
      auVar16 = auVar17._0_32_;
      if (0 < width) {
        lVar11 = 0;
        pauVar10 = (undefined1 (*) [32])src;
        do {
          auVar16 = *pauVar10;
          auVar13 = *(undefined1 (*) [32])(*pauVar10 + (long)src_stride * 2);
          auVar1 = *(undefined1 (*) [32])(*pauVar10 + (long)(src_stride * 2) * 2);
          auVar2 = *(undefined1 (*) [32])(*pauVar10 + (long)(src_stride * 3) * 2);
          auVar5 = vpaddw_avx2(auVar13,auVar16);
          auVar6 = vpaddw_avx2(auVar2,auVar1);
          auVar5 = vpaddw_avx2(auVar5,auVar6);
          auVar5 = vpmaddwd_avx2(auVar5,auVar15);
          auVar5 = vpaddd_avx2(auVar5,auVar14._0_32_);
          auVar14 = ZEXT3264(auVar5);
          auVar16 = vpmaddwd_avx2(auVar16,auVar16);
          auVar16 = vpaddd_avx2(auVar16,auVar17._0_32_);
          auVar13 = vpmaddwd_avx2(auVar13,auVar13);
          auVar1 = vpmaddwd_avx2(auVar1,auVar1);
          auVar13 = vpaddd_avx2(auVar13,auVar1);
          auVar16 = vpaddd_avx2(auVar16,auVar13);
          auVar13 = vpmaddwd_avx2(auVar2,auVar2);
          auVar16 = vpaddd_avx2(auVar16,auVar13);
          auVar17 = ZEXT3264(auVar16);
          lVar11 = lVar11 + 0x10;
          pauVar10 = pauVar10 + 1;
        } while (lVar11 < width);
      }
      auVar13 = auVar14._0_32_;
      auVar1 = vpunpckldq_avx2(auVar16,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      auVar16 = vpunpckhdq_avx2(auVar16,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      auVar16 = vpaddq_avx2(auVar12._0_32_,auVar16);
      auVar16 = vpaddq_avx2(auVar16,auVar1);
      auVar12 = ZEXT3264(auVar16);
      iVar9 = iVar9 + 4;
      src = (int16_t *)(*(undefined1 (*) [32])src + (long)(src_stride * 4) * 2);
    } while (iVar9 < height);
  }
  auVar3 = vphaddd_avx(auVar13._16_16_,auVar13._0_16_);
  auVar3 = vphaddd_avx(auVar3,auVar3);
  auVar3 = vphaddd_avx(auVar3,auVar3);
  *sum = *sum + auVar3._0_4_;
  auVar3 = vpaddq_avx(auVar16._0_16_,auVar16._16_16_);
  auVar4 = vpshufd_avx(auVar3,0xee);
  auVar3 = vpaddq_avx(auVar4,auVar3);
  return auVar3._0_8_;
}

Assistant:

uint64_t aom_sum_sse_2d_i16_avx2(const int16_t *src, int src_stride, int width,
                                 int height, int *sum) {
  if (LIKELY(width == 4 && height == 4)) {
    return aom_sum_sse_2d_i16_4x4_sse2(src, src_stride, sum);
  } else if (LIKELY(width == 4 && (height & 3) == 0)) {
    return aom_sum_sse_2d_i16_4xn_sse2(src, src_stride, height, sum);
  } else if (LIKELY(width == 8 && (height & 3) == 0)) {
    return aom_sum_sse_2d_i16_nxn_sse2(src, src_stride, width, height, sum);
  } else if (LIKELY(((width & 15) == 0) && ((height & 3) == 0))) {
    return aom_sum_sse_2d_i16_nxn_avx2(src, src_stride, width, height, sum);
  } else {
    return aom_sum_sse_2d_i16_c(src, src_stride, width, height, sum);
  }
}